

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::checkFormatSupport
               (ContextInfo *info,deUint32 format,deUint32 target,RenderContext *ctx)

{
  bool bVar1;
  bool bVar2;
  ContextType ctxType;
  ApiType requiredApiType;
  CompressedTexFormat format_00;
  uint uVar3;
  NotSupportedError *pNVar4;
  bool isES32;
  RenderContext *ctx_local;
  deUint32 target_local;
  deUint32 format_local;
  ContextInfo *info_local;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::es(3,2);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  bVar2 = glu::isCompressedFormat(format);
  if (bVar2) {
    format_00 = glu::mapGLCompressedTexFormat(format);
    bVar2 = tcu::isAstcFormat(format_00);
    if (bVar2) {
      bVar2 = glu::ContextInfo::isExtensionSupported(info,"GL_KHR_texture_compression_astc_hdr");
      if ((!bVar2) &&
         (bVar2 = glu::ContextInfo::isExtensionSupported(info,"GL_OES_texture_compression_astc"),
         !bVar2)) {
        if (target == 0x806f) {
          pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          tcu::NotSupportedError::NotSupportedError
                    (pNVar4,"TEXTURE_3D target requires HDR astc support.",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                     ,0x771);
          __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,
                      tcu::NotSupportedError::~NotSupportedError);
        }
        if ((!bVar1) &&
           (bVar1 = glu::ContextInfo::isExtensionSupported
                              (info,"GL_KHR_texture_compression_astc_ldr"), !bVar1)) {
          pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          tcu::NotSupportedError::NotSupportedError
                    (pNVar4,"Compressed astc texture not supported.",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                     ,0x773);
          __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,
                      tcu::NotSupportedError::~NotSupportedError);
        }
      }
    }
    else {
      uVar3 = (*info->_vptr_ContextInfo[10])(info,(ulong)format);
      if ((uVar3 & 1) == 0) {
        pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (pNVar4,"Compressed texture not supported.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                   ,0x779);
        __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
    }
  }
  return;
}

Assistant:

void checkFormatSupport (glu::ContextInfo& info, deUint32 format, deUint32 target, glu::RenderContext& ctx)
{
	const bool isES32 = glu::contextSupports(ctx.getType(), glu::ApiType::es(3, 2));

	if (glu::isCompressedFormat(format))
	{
		if (isAstcFormat(glu::mapGLCompressedTexFormat(format)))
		{
			DE_ASSERT(target != GL_RENDERBUFFER);
			if (!info.isExtensionSupported("GL_KHR_texture_compression_astc_hdr") &&
				!info.isExtensionSupported("GL_OES_texture_compression_astc"))
			{
				if (target == GL_TEXTURE_3D)
					TCU_THROW(NotSupportedError, "TEXTURE_3D target requires HDR astc support.");
				if (!isES32 && !info.isExtensionSupported("GL_KHR_texture_compression_astc_ldr"))
					TCU_THROW(NotSupportedError, "Compressed astc texture not supported.");
			}
		}
		else
		{
			if (!info.isCompressedTextureFormatSupported(format))
				TCU_THROW(NotSupportedError, "Compressed texture not supported.");
		}
	}
}